

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LayerParameter::SharedDtor(LayerParameter *this)

{
  string *psVar1;
  LayerParameter *pLVar2;
  LayerParameter *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->name_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena(&this->type_,psVar1);
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->transform_param_ != (TransformationParameter *)0x0)) {
    (*(this->transform_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->loss_param_ != (LossParameter *)0x0)) {
    (*(this->loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->accuracy_param_ != (AccuracyParameter *)0x0)) {
    (*(this->accuracy_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->argmax_param_ != (ArgMaxParameter *)0x0)) {
    (*(this->argmax_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->concat_param_ != (ConcatParameter *)0x0)) {
    (*(this->concat_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->contrastive_loss_param_ != (ContrastiveLossParameter *)0x0)) {
    (*(this->contrastive_loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->convolution_param_ != (ConvolutionParameter *)0x0)) {
    (*(this->convolution_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->data_param_ != (DataParameter *)0x0)) {
    (*(this->data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->dropout_param_ != (DropoutParameter *)0x0)) {
    (*(this->dropout_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->dummy_data_param_ != (DummyDataParameter *)0x0)) {
    (*(this->dummy_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->eltwise_param_ != (EltwiseParameter *)0x0)) {
    (*(this->eltwise_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->exp_param_ != (ExpParameter *)0x0)) {
    (*(this->exp_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->hdf5_data_param_ != (HDF5DataParameter *)0x0)) {
    (*(this->hdf5_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->hdf5_output_param_ != (HDF5OutputParameter *)0x0)) {
    (*(this->hdf5_output_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->hinge_loss_param_ != (HingeLossParameter *)0x0)) {
    (*(this->hinge_loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->image_data_param_ != (ImageDataParameter *)0x0)) {
    (*(this->image_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->infogain_loss_param_ != (InfogainLossParameter *)0x0)) {
    (*(this->infogain_loss_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->inner_product_param_ != (InnerProductParameter *)0x0)) {
    (*(this->inner_product_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->lrn_param_ != (LRNParameter *)0x0)) {
    (*(this->lrn_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->memory_data_param_ != (MemoryDataParameter *)0x0)) {
    (*(this->memory_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->mvn_param_ != (MVNParameter *)0x0)) {
    (*(this->mvn_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->pooling_param_ != (PoolingParameter *)0x0)) {
    (*(this->pooling_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->power_param_ != (PowerParameter *)0x0)) {
    (*(this->power_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->relu_param_ != (ReLUParameter *)0x0)) {
    (*(this->relu_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->sigmoid_param_ != (SigmoidParameter *)0x0)) {
    (*(this->sigmoid_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->softmax_param_ != (SoftmaxParameter *)0x0)) {
    (*(this->softmax_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->slice_param_ != (SliceParameter *)0x0)) {
    (*(this->slice_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->tanh_param_ != (TanHParameter *)0x0)) {
    (*(this->tanh_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->threshold_param_ != (ThresholdParameter *)0x0)) {
    (*(this->threshold_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->window_data_param_ != (WindowDataParameter *)0x0)) {
    (*(this->window_data_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->python_param_ != (PythonParameter *)0x0)) {
    (*(this->python_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->prelu_param_ != (PReLUParameter *)0x0)) {
    (*(this->prelu_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->spp_param_ != (SPPParameter *)0x0)) {
    (*(this->spp_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->reshape_param_ != (ReshapeParameter *)0x0)) {
    (*(this->reshape_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->log_param_ != (LogParameter *)0x0)) {
    (*(this->log_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->flatten_param_ != (FlattenParameter *)0x0)) {
    (*(this->flatten_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->reduction_param_ != (ReductionParameter *)0x0)) {
    (*(this->reduction_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->embed_param_ != (EmbedParameter *)0x0)) {
    (*(this->embed_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->tile_param_ != (TileParameter *)0x0)) {
    (*(this->tile_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->batch_norm_param_ != (BatchNormParameter *)0x0)) {
    (*(this->batch_norm_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->elu_param_ != (ELUParameter *)0x0)) {
    (*(this->elu_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->bias_param_ != (BiasParameter *)0x0)) {
    (*(this->bias_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->scale_param_ != (ScaleParameter *)0x0)) {
    (*(this->scale_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->input_param_ != (InputParameter *)0x0)) {
    (*(this->input_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->crop_param_ != (CropParameter *)0x0)) {
    (*(this->crop_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->parameter_param_ != (ParameterParameter *)0x0)) {
    (*(this->parameter_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  pLVar2 = internal_default_instance();
  if ((this != pLVar2) && (this->recurrent_param_ != (RecurrentParameter *)0x0)) {
    (*(this->recurrent_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void LayerParameter::SharedDtor() {
  name_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  type_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) {
    delete transform_param_;
  }
  if (this != internal_default_instance()) {
    delete loss_param_;
  }
  if (this != internal_default_instance()) {
    delete accuracy_param_;
  }
  if (this != internal_default_instance()) {
    delete argmax_param_;
  }
  if (this != internal_default_instance()) {
    delete concat_param_;
  }
  if (this != internal_default_instance()) {
    delete contrastive_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete convolution_param_;
  }
  if (this != internal_default_instance()) {
    delete data_param_;
  }
  if (this != internal_default_instance()) {
    delete dropout_param_;
  }
  if (this != internal_default_instance()) {
    delete dummy_data_param_;
  }
  if (this != internal_default_instance()) {
    delete eltwise_param_;
  }
  if (this != internal_default_instance()) {
    delete exp_param_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_data_param_;
  }
  if (this != internal_default_instance()) {
    delete hdf5_output_param_;
  }
  if (this != internal_default_instance()) {
    delete hinge_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete image_data_param_;
  }
  if (this != internal_default_instance()) {
    delete infogain_loss_param_;
  }
  if (this != internal_default_instance()) {
    delete inner_product_param_;
  }
  if (this != internal_default_instance()) {
    delete lrn_param_;
  }
  if (this != internal_default_instance()) {
    delete memory_data_param_;
  }
  if (this != internal_default_instance()) {
    delete mvn_param_;
  }
  if (this != internal_default_instance()) {
    delete pooling_param_;
  }
  if (this != internal_default_instance()) {
    delete power_param_;
  }
  if (this != internal_default_instance()) {
    delete relu_param_;
  }
  if (this != internal_default_instance()) {
    delete sigmoid_param_;
  }
  if (this != internal_default_instance()) {
    delete softmax_param_;
  }
  if (this != internal_default_instance()) {
    delete slice_param_;
  }
  if (this != internal_default_instance()) {
    delete tanh_param_;
  }
  if (this != internal_default_instance()) {
    delete threshold_param_;
  }
  if (this != internal_default_instance()) {
    delete window_data_param_;
  }
  if (this != internal_default_instance()) {
    delete python_param_;
  }
  if (this != internal_default_instance()) {
    delete prelu_param_;
  }
  if (this != internal_default_instance()) {
    delete spp_param_;
  }
  if (this != internal_default_instance()) {
    delete reshape_param_;
  }
  if (this != internal_default_instance()) {
    delete log_param_;
  }
  if (this != internal_default_instance()) {
    delete flatten_param_;
  }
  if (this != internal_default_instance()) {
    delete reduction_param_;
  }
  if (this != internal_default_instance()) {
    delete embed_param_;
  }
  if (this != internal_default_instance()) {
    delete tile_param_;
  }
  if (this != internal_default_instance()) {
    delete batch_norm_param_;
  }
  if (this != internal_default_instance()) {
    delete elu_param_;
  }
  if (this != internal_default_instance()) {
    delete bias_param_;
  }
  if (this != internal_default_instance()) {
    delete scale_param_;
  }
  if (this != internal_default_instance()) {
    delete input_param_;
  }
  if (this != internal_default_instance()) {
    delete crop_param_;
  }
  if (this != internal_default_instance()) {
    delete parameter_param_;
  }
  if (this != internal_default_instance()) {
    delete recurrent_param_;
  }
}